

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srsw_fifo_unittest.cpp
# Opt level: O0

void __thiscall
SRSWFifoUnitTest_test_basic_Test::SRSWFifoUnitTest_test_basic_Test
          (SRSWFifoUnitTest_test_basic_Test *this)

{
  SRSWFifoUnitTest_test_basic_Test *this_local;
  
  SRSWFifoUnitTest::SRSWFifoUnitTest(&this->super_SRSWFifoUnitTest);
  (this->super_SRSWFifoUnitTest).super_Test._vptr_Test =
       (_func_int **)&PTR__SRSWFifoUnitTest_test_basic_Test_0018b960;
  return;
}

Assistant:

TEST_F(SRSWFifoUnitTest, test_basic)
{
    int_fifo f(4);
    EXPECT_EQ(static_cast<size_t>(0u), f.size());
    EXPECT_EQ(4u, f.buffer_size());
    EXPECT_EQ(true, f.empty());
    EXPECT_EQ(false, f.full());
    {
        bool ok = f.push(10);
        EXPECT_EQ(true, ok);
        EXPECT_EQ(1u, f.size());
        EXPECT_EQ(10u, f.front());
        EXPECT_EQ(false, f.empty());
        EXPECT_EQ(false, f.full());
    }
    {
        bool ok = f.push(20);
        EXPECT_EQ(true, ok);
        EXPECT_EQ(2u, f.size());
        EXPECT_EQ(10u, f.front());
        EXPECT_EQ(false, f.empty());
        EXPECT_EQ(false, f.full());
    }
    {
        bool ok = f.push(30);
        EXPECT_EQ(true, ok);
        EXPECT_EQ(3u, f.size());
        EXPECT_EQ(10u, f.front());
        EXPECT_EQ(false, f.empty());
        EXPECT_EQ(true, f.full());
    }
    {
        bool ok = f.push(40);
        EXPECT_EQ(false, ok);
        EXPECT_EQ(3u, f.size());
        EXPECT_EQ(10u, f.front());
        EXPECT_EQ(false, f.empty());
        EXPECT_EQ(true, f.full());
    }
    {
        bool ok = f.pop();
        EXPECT_EQ(true, ok);
        EXPECT_EQ(2u, f.size());
        EXPECT_EQ(20u, f.front());
        EXPECT_EQ(false, f.empty());
        EXPECT_EQ(false, f.full());
    }

    {
        bool ok = f.push(40);
        EXPECT_EQ(true, ok);
        EXPECT_EQ(3u, f.size());
        EXPECT_EQ(20u, f.front());
        EXPECT_EQ(false, f.empty());
        EXPECT_EQ(true, f.full());
    }


    {
        bool ok = f.pop();
        EXPECT_EQ(true, ok);
        EXPECT_EQ(2u, f.size());
        EXPECT_EQ(30u, f.front());
        EXPECT_EQ(false, f.empty());
        EXPECT_EQ(false, f.full());
    }

    {
        bool ok = f.pop();
        EXPECT_EQ(true, ok);
        EXPECT_EQ(1u, f.size());
        EXPECT_EQ(40u, f.front());
        EXPECT_EQ(false, f.empty());
        EXPECT_EQ(false, f.full());
    }

    {
        bool ok = f.pop();
        EXPECT_EQ(true, ok);
        EXPECT_EQ(static_cast<size_t>(0u), f.size());
        EXPECT_EQ(true, f.empty());
        EXPECT_EQ(false, f.full());
    }

}